

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_light_calib.cpp
# Opt level: O3

bool svd(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         *A,int K,
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        *U,vector<double,_std::allocator<double>_> *S,
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        *V)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer pdVar3;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *pvVar4;
  int iVar5;
  time_t tVar6;
  double *x;
  double *x_00;
  double *x_01;
  ulong uVar7;
  ostream *poVar8;
  ulong uVar9;
  size_t __n;
  ulong uVar10;
  size_type __new_size;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int n;
  ulong uVar14;
  int n_00;
  ulong uVar15;
  double dVar16;
  double dVar17;
  value_type_conflict3 local_78;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_70;
  void *local_68;
  ulong local_60;
  ulong local_58;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_50;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_48;
  vector<double,_std::allocator<double>_> *local_40;
  double local_38;
  
  uVar7 = (ulong)(uint)K;
  pvVar1 = (A->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (A->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar9 = (long)*(pointer *)
                 ((long)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + 8) -
          *(long *)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data;
  local_48 = A;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::clear(U);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::clear(V);
  pdVar3 = (S->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((S->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pdVar3) {
    (S->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pdVar3;
  }
  uVar15 = ((long)pvVar2 - (long)pvVar1 >> 3) * -0x5555555555555555;
  __new_size = (size_type)K;
  local_78 = 0.0;
  local_40 = S;
  std::vector<double,_std::allocator<double>_>::resize(S,__new_size,&local_78);
  local_70 = U;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(U,__new_size);
  pvVar4 = local_70;
  n_00 = (int)uVar15;
  local_58 = uVar7;
  local_50 = V;
  if (K < 1) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(V,__new_size);
  }
  else {
    lVar11 = 0;
    do {
      local_78 = 0.0;
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((pvVar4->
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar11),(long)n_00,&local_78);
      lVar11 = lVar11 + 0x18;
    } while (uVar7 * 0x18 != lVar11);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(V,__new_size);
    if (0 < K) {
      lVar11 = local_58 * 0x18;
      lVar12 = 0;
      do {
        local_78 = 0.0;
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)
                   ((long)&(((V->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar12),(long)(int)(uVar9 >> 3),&local_78);
        lVar12 = lVar12 + 0x18;
      } while (lVar11 != lVar12);
    }
  }
  tVar6 = time((time_t *)0x0);
  srand((uint)tVar6);
  __n = (long)(uVar15 << 0x20) >> 0x1d;
  uVar7 = 0xffffffffffffffff;
  if (-1 < (long)(uVar15 << 0x20)) {
    uVar7 = __n;
  }
  x = (double *)operator_new__(uVar7);
  x_00 = (double *)operator_new__(uVar7);
  local_60 = (long)(uVar9 * 0x20000000) >> 0x1d;
  uVar7 = 0xffffffffffffffff;
  if (-1 < (long)(uVar9 * 0x20000000)) {
    uVar7 = local_60;
  }
  local_68 = operator_new__(uVar7);
  x_01 = (double *)operator_new__(uVar7);
  if (0 < K) {
    uVar15 = uVar15 & 0x7fffffff;
    uVar13 = (long)uVar9 >> 3 & 0x7fffffff;
    uVar7 = 0;
    do {
      do {
        if (0 < n_00) {
          uVar14 = 0;
          do {
            iVar5 = rand();
            x[uVar14] = (double)((float)iVar5 * 4.656613e-10);
            uVar14 = uVar14 + 1;
          } while (uVar15 != uVar14);
        }
        dVar16 = normalize(x,n_00);
      } while (dVar16 <= eps);
      if (1.0 < eps) {
        dVar16 = -1.0;
      }
      else {
        dVar16 = -1.0;
        if (0 < MAX_ITER) {
          iVar5 = 0;
          while( true ) {
            memset(x_00,0,__n);
            memset(x_01,0,local_60);
            n = (int)((long)uVar9 >> 3);
            if (0 < n_00) {
              uVar14 = 0;
              do {
                if (0 < n) {
                  dVar16 = x[uVar14];
                  lVar11 = *(long *)&(local_48->
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start[uVar14].
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data;
                  uVar10 = 0;
                  do {
                    x_01[uVar10] = *(double *)(lVar11 + uVar10 * 8) * dVar16 + x_01[uVar10];
                    uVar10 = uVar10 + 1;
                  } while (uVar13 != uVar10);
                }
                uVar14 = uVar14 + 1;
              } while (uVar14 != uVar15);
            }
            dVar16 = normalize(x_01,n);
            if (dVar16 < eps) break;
            if (uVar7 != 0) {
              pvVar1 = (local_50->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              uVar14 = 0;
              do {
                if (0 < n) {
                  lVar11 = *(long *)&pvVar1[uVar14].
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data;
                  dVar16 = 0.0;
                  uVar10 = 0;
                  do {
                    dVar16 = dVar16 + *(double *)(lVar11 + uVar10 * 8) * x_01[uVar10];
                    uVar10 = uVar10 + 1;
                  } while (uVar13 != uVar10);
                  uVar10 = 0;
                  do {
                    x_01[uVar10] = *(double *)(lVar11 + uVar10 * 8) * -dVar16 + x_01[uVar10];
                    uVar10 = uVar10 + 1;
                  } while (uVar13 != uVar10);
                }
                uVar14 = uVar14 + 1;
              } while (uVar14 != uVar7);
            }
            normalize(x_01,n);
            if (0 < n_00) {
              uVar14 = 0;
              do {
                if (0 < n) {
                  lVar11 = *(long *)&(local_48->
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start[uVar14].
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data;
                  dVar16 = x_00[uVar14];
                  uVar10 = 0;
                  do {
                    dVar16 = dVar16 + x_01[uVar10] * *(double *)(lVar11 + uVar10 * 8);
                    x_00[uVar14] = dVar16;
                    uVar10 = uVar10 + 1;
                  } while (uVar13 != uVar10);
                }
                uVar14 = uVar14 + 1;
              } while (uVar14 != uVar15);
            }
            dVar16 = normalize(x_00,n_00);
            if (dVar16 < eps) break;
            if (uVar7 != 0) {
              pvVar1 = (local_70->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              uVar14 = 0;
              do {
                if (0 < n_00) {
                  lVar11 = *(long *)&pvVar1[uVar14].
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data;
                  dVar17 = 0.0;
                  uVar10 = 0;
                  do {
                    dVar17 = dVar17 + *(double *)(lVar11 + uVar10 * 8) * x_00[uVar10];
                    uVar10 = uVar10 + 1;
                  } while (uVar15 != uVar10);
                  uVar10 = 0;
                  do {
                    x_00[uVar10] = *(double *)(lVar11 + uVar10 * 8) * -dVar17 + x_00[uVar10];
                    uVar10 = uVar10 + 1;
                  } while (uVar15 != uVar10);
                }
                uVar14 = uVar14 + 1;
              } while (uVar14 != uVar7);
            }
            normalize(x_00,n_00);
            if (n_00 < 1) {
              local_38 = 0.0;
            }
            else {
              local_38 = 0.0;
              uVar14 = 0;
              do {
                local_38 = local_38 + (x_00[uVar14] - x[uVar14]) * (x_00[uVar14] - x[uVar14]);
                uVar14 = uVar14 + 1;
              } while (uVar15 != uVar14);
            }
            memcpy(x,x_00,__n);
            memcpy(local_68,x_01,local_60);
            if ((local_38 < eps) || (iVar5 = iVar5 + 1, MAX_ITER <= iVar5)) break;
          }
        }
      }
      if (dVar16 < eps) {
        poVar8 = std::ostream::_M_insert<double>(dVar16);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        break;
      }
      (local_40->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar7] = dVar16;
      memcpy((local_70->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[uVar7].
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start,x,__n);
      memcpy((local_50->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[uVar7].
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start,local_68,local_60);
      uVar7 = uVar7 + 1;
    } while (uVar7 != local_58);
  }
  operator_delete__(x_00);
  operator_delete__(x_01);
  operator_delete__(x);
  operator_delete__(local_68);
  return true;
}

Assistant:

bool svd(vector<vector<double> > A, int K, vector<vector<double> > &U, vector<double> &S, vector<vector<double> > &V) {
	int M = A.size();
	int N = A[0].size();
	U.clear();
	V.clear();
	S.clear();
	S.resize(K, 0);
	U.resize(K);
	for (int i = 0; i < K; i++)
		U[i].resize(M, 0);
	V.resize(K);
	for (int i = 0; i < K; i++)
		V[i].resize(N, 0);


	srand(time(0));
	double *left_vector = new double[M];
	double *next_left_vector = new double[M];
	double *right_vector = new double[N];
	double *next_right_vector = new double[N];
	int col = 0;
	for (int col = 0; col < K; col++) {
		double diff = 1;
		double r = -1;
		while (1) {
			for (int i = 0; i < M; i++)
				left_vector[i] = (float)rand() / RAND_MAX;
			if (normalize(left_vector, M) > eps)
				break;
		}

		for (int iter = 0; diff >= eps && iter < MAX_ITER; iter++) {
			memset(next_left_vector, 0, sizeof(double)*M);
			memset(next_right_vector, 0, sizeof(double)*N);
			for (int i = 0; i < M; i++)
				for (int j = 0; j < N; j++)
					next_right_vector[j] += left_vector[i] * A[i][j];

			r = normalize(next_right_vector, N);
			if (r < eps) break;
			for (int i = 0; i < col; i++)
				orth(&V[i][0], next_right_vector, N);
			normalize(next_right_vector, N);

			for (int i = 0; i < M; i++)
				for (int j = 0; j < N; j++)
					next_left_vector[i] += next_right_vector[j] * A[i][j];
			r = normalize(next_left_vector, M);
			if (r < eps) break;
			for (int i = 0; i < col; i++)
				orth(&U[i][0], next_left_vector, M);
			normalize(next_left_vector, M);
			diff = 0;
			for (int i = 0; i < M; i++) {
				double d = next_left_vector[i] - left_vector[i];
				diff += d * d;
			}

			memcpy(left_vector, next_left_vector, sizeof(double)*M);
			memcpy(right_vector, next_right_vector, sizeof(double)*N);
		}
		if (r >= eps) {
			S[col] = r;
			memcpy((char *)&U[col][0], left_vector, sizeof(double)*M);
			memcpy((char *)&V[col][0], right_vector, sizeof(double)*N);
		}
		else {
			cout << r << endl;
			break;
		}
	}
	delete[] next_left_vector;
	delete[] next_right_vector;
	delete[] left_vector;
	delete[] right_vector;

	return true;
}